

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_trd.cpp
# Opt level: O1

bool __thiscall STrdHead::writeToFile(STrdHead *this,FILE *ftrd)

{
  word *pwVar1;
  byte *pbVar2;
  long lVar3;
  size_t sVar4;
  STrdFile (*__range1) [128];
  
  if (Options::IsBigEndian == '\x01') {
    pwVar1 = &(this->info).numOfFreeSectors;
    *pwVar1 = *pwVar1 << 8 | *pwVar1 >> 8;
    lVar3 = 0;
    do {
      pbVar2 = this->catalog[0].filename + lVar3 + 0xb;
      *(ushort *)pbVar2 = *(ushort *)pbVar2 << 8 | *(ushort *)pbVar2 >> 8;
      lVar3 = lVar3 + 0x10;
    } while (lVar3 != 0x800);
  }
  sVar4 = fwrite(this,0x900,1,(FILE *)ftrd);
  if ((sVar4 == 1) && (Options::IsBigEndian == '\x01')) {
    pwVar1 = &(this->info).numOfFreeSectors;
    *pwVar1 = *pwVar1 << 8 | *pwVar1 >> 8;
    lVar3 = 0;
    do {
      pbVar2 = this->catalog[0].filename + lVar3 + 0xb;
      *(ushort *)pbVar2 = *(ushort *)pbVar2 << 8 | *(ushort *)pbVar2 >> 8;
      lVar3 = lVar3 + 0x10;
    } while (lVar3 != 0x800);
  }
  return sVar4 == 1;
}

Assistant:

bool STrdHead::writeToFile(FILE *ftrd) {
	if (Options::IsBigEndian) swapEndianness();		// fix endianness in binary form before write
	if (1 != fwrite(this, sizeof(STrdHead), 1, ftrd)) return false;
	if (Options::IsBigEndian) swapEndianness();		// revert endianness back to native host form
	return true;
}